

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O2

string * tinyusdz::detail::to_xml_string<int>(string *__return_storage_ptr__,int *val)

{
  ::std::__cxx11::to_string(__return_storage_ptr__,*val);
  return __return_storage_ptr__;
}

Assistant:

std::string to_xml_string(const int &val) {
  return std::to_string(val);
}